

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

shared_ptr<kratos::FunctionCallStmt> *
kratos::FSM::get_func_call_stmt
          (shared_ptr<kratos::FunctionStmtBlock> *func_def,FSMState *fsm_state,
          shared_ptr<kratos::FunctionCallStmt> *func_stmt)

{
  size_t sVar1;
  bool bVar2;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *this;
  reference __in;
  type *ppVVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<kratos::Var> sVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_bool>
  pVar6;
  shared_ptr<kratos::FunctionCallStmt> local_108;
  _Base_ptr local_f8;
  undefined1 local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  shared_ptr<kratos::Var> var_to_;
  type *var_to;
  type *var_from;
  _Self local_80;
  const_iterator __end1;
  const_iterator __begin1;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *__range1;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *output_values;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  mapping;
  shared_ptr<kratos::FunctionCallStmt> *func_stmt_local;
  FSMState *fsm_state_local;
  shared_ptr<kratos::FunctionStmtBlock> *func_def_local;
  
  mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)func_stmt;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
         *)&output_values);
  this = FSMState::output_values(fsm_state);
  __end1 = std::
           map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
           ::begin(this);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
       ::end(this);
  while( true ) {
    bVar2 = std::operator!=(&__end1,&local_80);
    if (!bVar2) break;
    __in = std::_Rb_tree_const_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>_>::operator*
                     (&__end1);
    ppVVar3 = std::get<0ul,kratos::Var*const,kratos::Var*>(__in);
    var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::get<1ul,kratos::Var*const,kratos::Var*>(__in);
    if ((type)(var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_vptr__Sp_counted_base == (type)0x0) {
      sVar5 = std::enable_shared_from_this<kratos::Var>::shared_from_this
                        ((enable_shared_from_this<kratos::Var> *)local_a8);
      _Var4 = sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    else {
      sVar5 = std::enable_shared_from_this<kratos::Var>::shared_from_this
                        ((enable_shared_from_this<kratos::Var> *)local_a8);
      _Var4 = sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    (*((*ppVVar3)->super_IRNode)._vptr_IRNode[0x1f])(&local_e8,*ppVVar3,_Var4._M_pi);
    std::operator+(&local_c8,&local_e8,"_value");
    pVar6 = std::
            map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
            ::emplace<std::__cxx11::string,std::shared_ptr<kratos::Var>&>
                      ((map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                        *)&output_values,&local_c8,(shared_ptr<kratos::Var> *)local_a8);
    local_f8 = (_Base_ptr)pVar6.first._M_node;
    local_f0 = pVar6.second;
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_a8);
    std::_Rb_tree_const_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>_>::operator++(&__end1)
    ;
  }
  std::
  make_shared<kratos::FunctionCallStmt,std::shared_ptr<kratos::FunctionStmtBlock>const&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>&>
            ((shared_ptr<kratos::FunctionStmtBlock> *)&local_108,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)func_def);
  std::shared_ptr<kratos::FunctionCallStmt>::operator=
            ((shared_ptr<kratos::FunctionCallStmt> *)
             mapping._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_108);
  std::shared_ptr<kratos::FunctionCallStmt>::~shared_ptr(&local_108);
  sVar1 = mapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *)&output_values);
  return (shared_ptr<kratos::FunctionCallStmt> *)sVar1;
}

Assistant:

std::shared_ptr<FunctionCallStmt>& FSM::get_func_call_stmt(
    const std::shared_ptr<FunctionStmtBlock>& func_def, const FSMState* fsm_state,
    std::shared_ptr<FunctionCallStmt>& func_stmt) {
    // get arg mapping
    std::map<std::string, std::shared_ptr<Var>> mapping;
    auto const& output_values = fsm_state->output_values();
    for (auto const& [var_from, var_to] : output_values) {
        std::shared_ptr<Var> var_to_ =
            var_to ? var_to->shared_from_this() : var_from->shared_from_this();
        mapping.emplace(var_from->to_string() + "_value", var_to_);
    }
    func_stmt = std::make_shared<FunctionCallStmt>(func_def, mapping);
    return func_stmt;
}